

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

void __thiscall backward::Colorize::activate(Colorize *this,type mode,FILE *fp)

{
  int fd;
  
  fd = fileno((FILE *)fp);
  activate(this,mode,fd);
  return;
}

Assistant:

void activate(ColorMode::type mode, FILE *fp) { activate(mode, fileno(fp)); }